

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O0

double __thiscall UniValue::get_real(UniValue *this)

{
  long lVar1;
  bool bVar2;
  runtime_error *this_00;
  string *in_RDI;
  long in_FS_OFFSET;
  double retval;
  UniValue *in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffd8;
  VType *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  checkType((UniValue *)CONCAT44(4,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  getValStr_abi_cxx11_(in_stack_ffffffffffffffa8);
  bVar2 = anon_unknown.dwarf_1f0af62::ParseDouble(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (double)in_stack_ffffffffffffffe8;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON double out of range");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

double UniValue::get_real() const
{
    checkType(VNUM);
    double retval;
    if (!ParseDouble(getValStr(), &retval))
        throw std::runtime_error("JSON double out of range");
    return retval;
}